

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBMultiFabUtil.cpp
# Opt level: O0

void amrex::EB_set_covered
               (MultiFab *mf,int icomp,int ncomp,int ngrow,
               Vector<double,_std::allocator<double>_> *a_vals)

{
  bool bVar1;
  IndexType IVar2;
  IndexType IVar3;
  FabFactory<amrex::FArrayBox> *pFVar4;
  iterator pdVar5;
  int in_EDX;
  int in_ESI;
  FabArray<amrex::EBCellFlagFab> *in_RDI;
  int i_1;
  int j_1;
  int k_1;
  int n_1;
  Dim3 amrex_i_hi_1;
  Dim3 amrex_i_lo_1;
  int i;
  int j;
  int k;
  int n;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Array4<double> *arr;
  Array4<const_amrex::EBCellFlag> *flagarr;
  Box *bx;
  MFIter mfi;
  Real *vals;
  DeviceVector<Real> vals_dv;
  int ng;
  bool is_cell_centered;
  FabArray<amrex::EBCellFlagFab> *flags;
  EBFArrayBoxFactory *factory;
  FabArrayBase *in_stack_fffffffffffffa88;
  EBFArrayBoxFactory *in_stack_fffffffffffffa90;
  MFIter *mfi_00;
  FabArray<amrex::EBCellFlagFab> *this;
  long local_560;
  int local_550;
  undefined4 in_stack_fffffffffffffab4;
  undefined1 do_tiling_;
  int iVar6;
  undefined4 in_stack_fffffffffffffab8;
  int iVar7;
  undefined4 in_stack_fffffffffffffabc;
  int iVar8;
  MFIter *in_stack_fffffffffffffac0;
  int in_stack_fffffffffffffafc;
  int in_stack_fffffffffffffb00;
  int in_stack_fffffffffffffb04;
  int local_4f8;
  int local_4f4;
  long local_4b0;
  long local_4a8;
  long local_4a0;
  long local_498;
  int local_490;
  int local_48c;
  int local_488;
  long *local_470;
  long local_468 [8];
  long *local_428;
  int local_41c [7];
  int *local_400;
  MFIter local_3e8;
  double *local_388;
  double *local_380;
  double *local_378;
  char *in_stack_fffffffffffffca8;
  int local_350;
  int in_stack_fffffffffffffcb4;
  int in_stack_fffffffffffffcb8;
  int in_stack_fffffffffffffcbc;
  uint uVar9;
  int local_31c;
  int local_318;
  int local_314;
  FabArray<amrex::EBCellFlagFab> *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  undefined1 *local_2f8;
  undefined8 local_2f0;
  undefined4 local_2e4;
  char *local_2e0;
  char *local_2d8;
  undefined8 local_2d0;
  int local_2c8;
  int *local_2c0;
  int local_2b4;
  int iStack_2b0;
  int local_2ac;
  undefined8 local_2a8;
  int local_2a0;
  int *local_298;
  int local_28c;
  int iStack_288;
  int local_284;
  undefined8 local_280;
  int local_278;
  int *local_270;
  int local_264;
  int iStack_260;
  int local_25c;
  undefined8 local_258;
  int local_250;
  int *local_248;
  int local_240;
  int iStack_23c;
  int local_238;
  int local_234;
  int local_230;
  int local_22c;
  long *local_228;
  uint *local_220;
  int local_218;
  int local_214;
  int local_210;
  int local_20c;
  long *local_208;
  double *local_200;
  long *local_1f8;
  long *local_1f0;
  int local_1e4;
  int local_1e0;
  int local_1dc;
  int local_1d8;
  int local_1d4;
  int local_1d0;
  int local_1cc;
  long *local_1c8;
  int local_1bc;
  int local_1b8;
  int local_1b4;
  long *local_1b0;
  int local_1a4;
  int local_1a0;
  int local_19c;
  long *local_198;
  int local_18c;
  int local_188;
  int local_184;
  long *local_180;
  int local_174;
  int local_170;
  int local_16c;
  long *local_168;
  int local_15c;
  int local_158;
  int local_154;
  long *local_150;
  int local_144;
  int local_140;
  int local_13c;
  long *local_138;
  int local_12c;
  int local_128;
  int local_124;
  long *local_120;
  uint *local_118;
  uint *local_110;
  uint *local_108;
  uint *local_100;
  uint *local_f8;
  uint *local_f0;
  uint *local_e8;
  uint *local_e0;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  long *local_c8;
  undefined4 local_bc;
  int *local_b8;
  undefined4 local_ac;
  int *local_a8;
  undefined4 local_9c;
  int *local_98;
  undefined4 local_8c;
  int *local_88;
  undefined4 local_7c;
  int *local_78;
  undefined4 local_6c;
  int *local_68;
  undefined4 local_5c;
  int *local_58;
  undefined4 local_4c;
  int *local_48;
  undefined4 local_3c;
  int *local_38;
  undefined4 local_2c;
  int *local_28;
  undefined4 local_1c;
  int *local_18;
  undefined4 local_c;
  int *local_8;
  
  do_tiling_ = (undefined1)((uint)in_stack_fffffffffffffab4 >> 0x18);
  local_318 = in_EDX;
  local_314 = in_ESI;
  local_310 = in_RDI;
  pFVar4 = FabArray<amrex::FArrayBox>::Factory((FabArray<amrex::FArrayBox> *)0x13deb39);
  if (pFVar4 == (FabFactory<amrex::FArrayBox> *)0x0) {
    local_560 = 0;
  }
  else {
    local_560 = __dynamic_cast(pFVar4,&FabFactory<amrex::FArrayBox>::typeinfo,
                               &EBFArrayBoxFactory::typeinfo,0);
  }
  if (local_560 != 0) {
    EBFArrayBoxFactory::getMultiEBCellFlagFab(in_stack_fffffffffffffa90);
    IVar2 = FabArrayBase::ixType(in_stack_fffffffffffffa88);
    local_300 = &stack0xfffffffffffffcc4;
    if (IVar2.itype != 0) {
      IVar3 = FabArrayBase::ixType(in_stack_fffffffffffffa88);
      local_2f8 = &stack0xfffffffffffffcc0;
      if (IVar3.itype != 7) {
        local_2d8 = "mf.ixType().cellCentered() || mf.ixType().nodeCentered()";
        local_2e0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/EB/AMReX_EBMultiFabUtil.cpp"
        ;
        local_2e4 = 0x4b;
        local_2f0 = 0;
        Assert_host((char *)CONCAT44(IVar2.itype,IVar3.itype),
                    (char *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
                    in_stack_fffffffffffffcb4,in_stack_fffffffffffffca8);
      }
    }
    IVar2 = FabArrayBase::ixType(in_stack_fffffffffffffa88);
    local_308 = &stack0xfffffffffffffcb8;
    uVar9 = (uint)(IVar2.itype == 0) << 0x18;
    local_350 = FabArrayBase::nGrow(&local_310->super_FabArrayBase,0);
    std::min<int>(&local_350,&local_31c);
    Vector<double,_std::allocator<double>_>::size
              ((Vector<double,_std::allocator<double>_> *)0x13decd8);
    mfi_00 = (MFIter *)&stack0xfffffffffffffc98;
    PODVector<double,_std::allocator<double>_>::PODVector
              ((PODVector<double,_std::allocator<double>_> *)mfi_00,
               (size_type)in_stack_fffffffffffffa88);
    local_378 = (double *)
                std::vector<double,_std::allocator<double>_>::begin
                          ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa88);
    local_380 = (double *)
                std::vector<double,_std::allocator<double>_>::end
                          ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa88);
    pdVar5 = PODVector<double,_std::allocator<double>_>::begin
                       ((PODVector<double,_std::allocator<double>_> *)mfi_00);
    Gpu::
    copy<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,double*>
              (local_378,local_380,pdVar5);
    local_388 = PODVector<double,_std::allocator<double>_>::data
                          ((PODVector<double,_std::allocator<double>_> *)mfi_00);
    TilingIfNotGPU();
    MFIter::MFIter(in_stack_fffffffffffffac0,
                   (FabArrayBase *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
                   (bool)do_tiling_);
    this = local_310;
    while (bVar1 = MFIter::isValid(&local_3e8), bVar1) {
      MFIter::growntilebox
                ((MFIter *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
                 in_stack_fffffffffffffafc);
      local_400 = local_41c;
      FabArray<amrex::EBCellFlagFab>::const_array<amrex::EBCellFlagFab,_0>(this,mfi_00);
      local_428 = local_468;
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)this,mfi_00);
      local_470 = &local_4b0;
      if ((uVar9 & 0x1000000) == 0) {
        local_2c0 = local_400;
        local_8 = local_400;
        local_c = 0;
        local_2b4 = *local_400;
        local_18 = local_400;
        local_1c = 1;
        iStack_2b0 = local_400[1];
        local_2d0 = *(undefined8 *)local_400;
        local_28 = local_400;
        local_2c = 2;
        local_2c8 = local_400[2];
        local_270 = local_400;
        local_68 = local_400 + 3;
        local_6c = 0;
        local_264 = *local_68;
        local_78 = local_400 + 3;
        local_7c = 1;
        iStack_260 = local_400[4];
        local_280 = *(undefined8 *)local_68;
        local_88 = local_400 + 3;
        local_8c = 2;
        local_278 = local_400[5];
        for (iVar8 = 0; iVar7 = local_2c8, local_2ac = local_2c8, local_25c = local_278,
            iVar8 < local_318; iVar8 = iVar8 + 1) {
          for (; iVar6 = iStack_2b0, iVar7 <= local_278; iVar7 = iVar7 + 1) {
            for (; local_550 = local_2b4, iVar6 <= iStack_260; iVar6 = iVar6 + 1) {
              for (; local_550 <= local_264; local_550 = local_550 + 1) {
                local_1d8 = local_550;
                local_1f8 = local_428;
                local_200 = local_388;
                local_120 = local_428;
                local_124 = local_550 + -1;
                local_128 = iVar6 + -1;
                local_12c = iVar7 + -1;
                local_e0 = (uint *)(*local_428 +
                                   ((long)(local_124 - (int)local_428[4]) +
                                    (long)(local_128 - *(int *)((long)local_428 + 0x24)) *
                                    local_428[1] +
                                   (long)(local_12c - (int)local_428[5]) * local_428[2]) * 4);
                if ((*local_e0 & 3) == 3) {
                  local_140 = iVar6 + -1;
                  local_144 = iVar7 + -1;
                  local_138 = local_428;
                  local_13c = local_550;
                  local_e8 = (uint *)(*local_428 +
                                     ((long)(local_550 - (int)local_428[4]) +
                                      (long)(local_140 - *(int *)((long)local_428 + 0x24)) *
                                      local_428[1] +
                                     (long)(local_144 - (int)local_428[5]) * local_428[2]) * 4);
                  if ((*local_e8 & 3) == 3) {
                    local_154 = local_550 + -1;
                    local_15c = iVar7 + -1;
                    local_150 = local_428;
                    local_f0 = (uint *)(*local_428 +
                                       ((long)(local_154 - (int)local_428[4]) +
                                        (long)(iVar6 - *(int *)((long)local_428 + 0x24)) *
                                        local_428[1] +
                                       (long)(local_15c - (int)local_428[5]) * local_428[2]) * 4);
                    local_158 = iVar6;
                    if ((*local_f0 & 3) == 3) {
                      local_174 = iVar7 + -1;
                      local_168 = local_428;
                      local_16c = local_550;
                      local_f8 = (uint *)(*local_428 +
                                         ((long)(local_550 - (int)local_428[4]) +
                                          (long)(iVar6 - *(int *)((long)local_428 + 0x24)) *
                                          local_428[1] +
                                         (long)(local_174 - (int)local_428[5]) * local_428[2]) * 4);
                      local_170 = iVar6;
                      if ((*local_f8 & 3) == 3) {
                        local_184 = local_550 + -1;
                        local_188 = iVar6 + -1;
                        local_180 = local_428;
                        local_100 = (uint *)(*local_428 +
                                            ((long)(local_184 - (int)local_428[4]) +
                                             (long)(local_188 - *(int *)((long)local_428 + 0x24)) *
                                             local_428[1] +
                                            (long)(iVar7 - (int)local_428[5]) * local_428[2]) * 4);
                        local_18c = iVar7;
                        if ((*local_100 & 3) == 3) {
                          local_1a0 = iVar6 + -1;
                          local_198 = local_428;
                          local_19c = local_550;
                          local_108 = (uint *)(*local_428 +
                                              ((long)(local_550 - (int)local_428[4]) +
                                               (long)(local_1a0 - *(int *)((long)local_428 + 0x24))
                                               * local_428[1] +
                                              (long)(iVar7 - (int)local_428[5]) * local_428[2]) * 4)
                          ;
                          local_1a4 = iVar7;
                          if ((*local_108 & 3) == 3) {
                            local_1b4 = local_550 + -1;
                            local_1b0 = local_428;
                            local_110 = (uint *)(*local_428 +
                                                ((long)(local_1b4 - (int)local_428[4]) +
                                                 (long)(iVar6 - *(int *)((long)local_428 + 0x24)) *
                                                 local_428[1] +
                                                (long)(iVar7 - (int)local_428[5]) * local_428[2]) *
                                                4);
                            local_1bc = iVar7;
                            local_1b8 = iVar6;
                            if ((*local_110 & 3) == 3) {
                              local_1c8 = local_428;
                              local_1cc = local_550;
                              local_118 = (uint *)(*local_428 +
                                                  ((long)(local_550 - (int)local_428[4]) +
                                                   (long)(iVar6 - *(int *)((long)local_428 + 0x24))
                                                   * local_428[1] +
                                                  (long)(iVar7 - (int)local_428[5]) * local_428[2])
                                                  * 4);
                              local_1d4 = iVar7;
                              local_1d0 = iVar6;
                              if ((*local_118 & 3) == 3) {
                                local_d8 = iVar8 + local_314;
                                local_cc = local_550;
                                *(double *)
                                 (local_4b0 +
                                 ((long)(local_550 - local_490) + (iVar6 - local_48c) * local_4a8 +
                                  (iVar7 - local_488) * local_4a0 + local_d8 * local_498) * 8) =
                                     local_388[iVar8];
                                local_d4 = iVar7;
                                local_d0 = iVar6;
                                local_c8 = local_470;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
                local_1f0 = local_470;
                local_1e4 = iVar8;
                local_1e0 = iVar7;
                local_1dc = iVar6;
              }
            }
          }
        }
      }
      else {
        local_298 = local_400;
        local_38 = local_400;
        local_3c = 0;
        local_28c = *local_400;
        local_48 = local_400;
        local_4c = 1;
        iStack_288 = local_400[1];
        local_2a8 = *(undefined8 *)local_400;
        local_58 = local_400;
        local_5c = 2;
        local_2a0 = local_400[2];
        local_248 = local_400;
        local_98 = local_400 + 3;
        local_9c = 0;
        local_240 = *local_98;
        local_a8 = local_400 + 3;
        local_ac = 1;
        iStack_23c = local_400[4];
        local_258 = *(undefined8 *)local_98;
        local_b8 = local_400 + 3;
        local_bc = 2;
        local_250 = local_400[5];
        for (local_4f4 = 0; local_4f8 = local_2a0, local_284 = local_2a0, local_238 = local_250,
            local_4f4 < local_318; local_4f4 = local_4f4 + 1) {
          for (; iVar8 = iStack_288, local_4f8 <= local_250; local_4f8 = local_4f8 + 1) {
            for (; iVar7 = local_28c, iVar8 <= iStack_23c; iVar8 = iVar8 + 1) {
              while (in_stack_fffffffffffffb00 = iVar7, in_stack_fffffffffffffb00 <= local_240) {
                local_228 = local_428;
                local_234 = local_4f8;
                local_220 = (uint *)(*local_428 +
                                    ((long)(in_stack_fffffffffffffb00 - (int)local_428[4]) +
                                     (long)(iVar8 - *(int *)((long)local_428 + 0x24)) * local_428[1]
                                    + (long)(local_4f8 - (int)local_428[5]) * local_428[2]) * 4);
                if ((*local_220 & 3) == 3) {
                  local_218 = local_4f4 + local_314;
                  local_214 = local_4f8;
                  *(double *)
                   (local_4b0 +
                   ((long)(in_stack_fffffffffffffb00 - local_490) + (iVar8 - local_48c) * local_4a8
                    + (local_4f8 - local_488) * local_4a0 + local_218 * local_498) * 8) =
                       local_388[local_4f4];
                  local_210 = iVar8;
                  local_20c = in_stack_fffffffffffffb00;
                  local_208 = local_470;
                }
                local_230 = iVar8;
                local_22c = in_stack_fffffffffffffb00;
                iVar7 = in_stack_fffffffffffffb00 + 1;
              }
            }
            in_stack_fffffffffffffb04 = iVar8;
          }
        }
      }
      MFIter::operator++(&local_3e8);
    }
    MFIter::~MFIter(mfi_00);
    PODVector<double,_std::allocator<double>_>::~PODVector
              ((PODVector<double,_std::allocator<double>_> *)mfi_00);
  }
  return;
}

Assistant:

void
EB_set_covered (MultiFab& mf, int icomp, int ncomp, int ngrow, const Vector<Real>& a_vals)
{
    const auto factory = dynamic_cast<EBFArrayBoxFactory const*>(&(mf.Factory()));
    if (factory == nullptr) return;
    const auto& flags = factory->getMultiEBCellFlagFab();

    AMREX_ALWAYS_ASSERT(mf.ixType().cellCentered() || mf.ixType().nodeCentered());
    bool is_cell_centered = mf.ixType().cellCentered();
    int ng = std::min(mf.nGrow(),ngrow);

    Gpu::DeviceVector<Real> vals_dv(a_vals.size());
    Gpu::copy(Gpu::hostToDevice, a_vals.begin(), a_vals.end(), vals_dv.begin());
    Real const* AMREX_RESTRICT vals = vals_dv.data();

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(mf,TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.growntilebox(ng);
        const auto& flagarr = flags.const_array(mfi);
        Array4<Real> const& arr = mf.array(mfi);

        if (is_cell_centered) {
            AMREX_HOST_DEVICE_FOR_4D ( bx, ncomp, i, j, k, n,
            {
                if (flagarr(i,j,k).isCovered()) {
                    arr(i,j,k,n+icomp) = vals[n];
                }
            });
        } else {
            AMREX_HOST_DEVICE_FOR_4D (bx, ncomp, i, j, k, n,
            {
                eb_set_covered_nodes(i,j,k,n,icomp,arr,flagarr,vals);
            });
        }
    }
}